

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_fillDoubleHashTable
               (ZSTD_matchState_t *ms,void *end,ZSTD_dictTableLoadMethod_e dtlm,
               ZSTD_tableFillPurpose_e tfp)

{
  int in_ECX;
  ZSTD_dictTableLoadMethod_e in_stack_00000054;
  void *in_stack_00000058;
  ZSTD_matchState_t *in_stack_00000060;
  
  if (in_ECX == 1) {
    ZSTD_fillDoubleHashTableForCDict(in_stack_00000060,in_stack_00000058,in_stack_00000054);
  }
  else {
    ZSTD_fillDoubleHashTableForCCtx(in_stack_00000060,in_stack_00000058,in_stack_00000054);
  }
  return;
}

Assistant:

void ZSTD_fillDoubleHashTable(ZSTD_matchState_t* ms,
                        const void* const end,
                        ZSTD_dictTableLoadMethod_e dtlm,
                        ZSTD_tableFillPurpose_e tfp)
{
    if (tfp == ZSTD_tfp_forCDict) {
        ZSTD_fillDoubleHashTableForCDict(ms, end, dtlm);
    } else {
        ZSTD_fillDoubleHashTableForCCtx(ms, end, dtlm);
    }
}